

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_procedure_op
               (sexp ctx,sexp self,sexp_sint_t n,sexp flags,sexp num_args,sexp bc,sexp vars)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  sexp in_RCX;
  size_t in_R8;
  sexp_uint_t in_R9;
  sexp proc;
  
  psVar2 = sexp_alloc_tagged_aux(in_RCX,in_R8,in_R9);
  (psVar2->value).flonum_bits[0x10] = (char)in_RCX;
  auVar1._8_8_ = (long)in_R8 >> 0x3f;
  auVar1._0_8_ = in_R8 & 0xfffffffffffffffe;
  (psVar2->value).procedure.num_args = SUB164(auVar1 / SEXT816(2),0);
  (psVar2->value).stack.length = in_R9;
  (psVar2->value).type.cpl = bc;
  return psVar2;
}

Assistant:

sexp sexp_make_procedure_op (sexp ctx, sexp self, sexp_sint_t n, sexp flags,
                             sexp num_args, sexp bc, sexp vars) {
  sexp proc = sexp_alloc_type(ctx, procedure, SEXP_PROCEDURE);
  sexp_procedure_flags(proc) = (char) (sexp_uint_t) flags;
  sexp_procedure_num_args(proc) = sexp_unbox_fixnum(num_args);
  sexp_procedure_code(proc) = bc;
  sexp_procedure_vars(proc) = vars;
  return proc;
}